

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void checkArguments(char **argv,size_t *numProducers,size_t *numConsumers,size_t *buffer_capacity,
                   size_t *target)

{
  int *piVar1;
  uintmax_t uVar2;
  ostream *poVar3;
  uintmax_t *in_RCX;
  uintmax_t *in_RDX;
  uintmax_t *in_RSI;
  undefined8 *in_RDI;
  uintmax_t *in_R8;
  uchar i;
  size_t argCheck;
  byte local_31;
  
  local_31 = 1;
  while ((local_31 < 5 && (*(char *)in_RDI[local_31] != '-'))) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoumax((char *)in_RDI[local_31],(char **)0x0,10);
    piVar1 = __errno_location();
    if ((*piVar1 == 0x22) || (uVar2 == 0)) break;
    switch(local_31) {
    case 1:
      *in_RSI = uVar2;
      break;
    case 2:
      *in_RDX = uVar2;
      break;
    case 3:
      *in_RCX = uVar2;
      break;
    case 4:
      *in_R8 = uVar2;
      return;
    }
    local_31 = local_31 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"argument ");
  poVar3 = std::operator<<(poVar3,local_31);
  poVar3 = std::operator<<(poVar3," (\'");
  poVar3 = std::operator<<(poVar3,(char *)in_RDI[local_31]);
  poVar3 = std::operator<<(poVar3,
                           "\') not valid. Please provide a positive integer no greater than ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xffffffffffffffff);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar3 = std::operator<<(poVar3,(char *)*in_RDI);
  poVar3 = std::operator<<(poVar3,
                           " <# producer threads> <# consumer threads> <buffer size> <# items to produce>"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void checkArguments(const char *argv[], std::size_t *numProducers, std::size_t *numConsumers, std::size_t *buffer_capacity, std::size_t *target){
    std::size_t argCheck;
    unsigned char i = 1;
    for(; i < 5; ++i){//Ensure all provided arguments are valid
	if(argv[i][0] == '-')
	    break;
	errno = 0;
	argCheck = std::strtoumax(argv[i], NULL, 10);
	if(errno == ERANGE || argCheck == 0)
	    break;
        switch(i){
            case 1:
                *numProducers = argCheck;
                continue;
            case 2:
                *numConsumers = argCheck;
                continue;
            case 3:
		*buffer_capacity = argCheck;
                continue;
            case 4:
		*target = argCheck;
		return;
        }
    }
    std::cerr << "argument " << i << " (\'" << argv[i] << "\') not valid. Please provide a positive integer no greater than " << SIZE_MAX << std::endl;
    std::cerr << "Usage: " << argv[0] << " <# producer threads> <# consumer threads> <buffer size> <# items to produce>" << std::endl;
}